

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 c_v64_from_16(uint16_t a,uint16_t b,uint16_t c,uint16_t d)

{
  undefined2 in_register_0000000a;
  undefined6 in_register_00000032;
  
  return (c_v64)((ulong)CONCAT22(in_register_0000000a,d) |
                (CONCAT62(in_register_00000032,b) << 0x20) + ((ulong)a << 0x30) | (ulong)c << 0x10);
}

Assistant:

SIMD_INLINE c_v64 c_v64_from_16(uint16_t a, uint16_t b, uint16_t c,
                                uint16_t d) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    t.u16[0] = a;
    t.u16[1] = b;
    t.u16[2] = c;
    t.u16[3] = d;
  } else {
    t.u16[3] = a;
    t.u16[2] = b;
    t.u16[1] = c;
    t.u16[0] = d;
  }
  return t;
}